

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O2

void Io_ReadPlaCubePreprocess(Vec_Str_t *vSop,int iCover,int fVerbose)

{
  uint nCubes;
  uint nVars;
  word **pCs;
  Vec_Bit_t *vMarks;
  int *__s;
  int nWords;
  int iVar1;
  size_t __size;
  
  pCs = Io_ReadPlaCubeSetup(vSop);
  nCubes = Abc_SopGetCubeNum(vSop->pArray);
  nVars = Abc_SopGetVarNum(vSop->pArray);
  nWords = (((int)nVars >> 5) + 1) - (uint)((nVars & 0x1f) == 0);
  iVar1 = (((int)nCubes >> 5) + 1) - (uint)((nCubes & 0x1f) == 0);
  vMarks = (Vec_Bit_t *)malloc(0x10);
  vMarks->nCap = iVar1 * 0x20;
  if (iVar1 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar1 << 2;
    __s = (int *)malloc(__size);
  }
  vMarks->pArray = __s;
  vMarks->nSize = iVar1 * 0x20;
  memset(__s,0,__size);
  if (fVerbose != 0) {
    printf("Cover %5d : V =%5d  C%d =%5d",(ulong)(uint)iCover,(ulong)nVars,0,(ulong)nCubes);
  }
  do {
    Io_ReadPlaMarkContained(pCs,nCubes,nWords,vMarks);
    nCubes = Io_ReadPlaRemoveMarked(pCs,nCubes,nWords,vMarks);
    iVar1 = Io_ReadPlaMergeDistance1(pCs,nCubes,nWords,vMarks);
  } while (iVar1 != 0);
  if (fVerbose == 0) {
    Io_ReadPlaCubeSetdown(vSop,pCs,nCubes,nVars);
  }
  else {
    printf("  C%d =%5d",1,(ulong)nCubes);
    printf("%4d",0);
    Io_ReadPlaCubeSetdown(vSop,pCs,nCubes,nVars);
    putchar(10);
  }
  free(vMarks->pArray);
  free(vMarks);
  free(*pCs);
  free(pCs);
  return;
}

Assistant:

void Io_ReadPlaCubePreprocess( Vec_Str_t * vSop, int iCover, int fVerbose )
{
    word ** pCs = Io_ReadPlaCubeSetup( vSop );
    int nCubes  = Abc_SopGetCubeNum( Vec_StrArray(vSop) );
    int nVars   = Abc_SopGetVarNum( Vec_StrArray(vSop) );
    int nWords  = Abc_Bit6WordNum( 2*nVars );
    int nCubesNew, Count, Iter = 0;
    Vec_Bit_t * vMarks = Vec_BitStart( nCubes );
    if ( fVerbose )
        printf( "Cover %5d : V =%5d  C%d =%5d", iCover, nVars, Iter, nCubes );

    do 
    {
        Iter++;
        do 
        {
            // remove contained
            Io_ReadPlaMarkContained( pCs, nCubes, nWords, vMarks );
            nCubesNew = Io_ReadPlaRemoveMarked( pCs, nCubes, nWords, vMarks );
            //if ( fVerbose )
            //    printf( "  C =%5d", nCubes - nCubesNew );
            nCubes = nCubesNew;
            // merge distance-1
            Count = Io_ReadPlaMergeDistance1( pCs, nCubes, nWords, vMarks );
        } while ( Count );
        if ( fVerbose )
            printf( "  C%d =%5d", Iter, nCubes );
        // try consensus
        //Count = Io_ReadPlaSelfSubsumption( pCs, nCubes, nWords, vMarks );
        if ( fVerbose )
            printf( "%4d", Count );
    } while ( Count );

    // translate
    Io_ReadPlaCubeSetdown( vSop, pCs, nCubes, nVars );
    // finalize
    if ( fVerbose )
        printf( "\n" );
    Vec_BitFree( vMarks );
    ABC_FREE( pCs[0] );
    ABC_FREE( pCs );
}